

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined8 in_RCX;
  allocator_type *in_RSI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDI;
  int ret;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat reference_blob;
  int outh;
  int outw;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar2;
  Mat *in_stack_ffffffffffffff18;
  Mat *this_00;
  allocator_type *in_stack_ffffffffffffff20;
  undefined1 *__n;
  undefined1 local_c1 [48];
  undefined1 local_91;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_90;
  Mat local_78;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 local_20;
  allocator_type *local_10;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)((long)&in_RDI[9].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start + 4);
  local_30 = *(int *)&in_RDI[9].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if (*(int *)(in_RSI + 0x28) == 1) {
    local_24 = 1;
    local_28 = 1;
  }
  if ((local_2c == 0) || (local_30 == 0)) {
    local_2c = (int)((float)local_24 *
                    *(float *)((long)&in_RDI[8].
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_30 = (int)((float)local_28 *
                    *(float *)&in_RDI[9].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  }
  local_20 = in_RCX;
  local_10 = in_RSI;
  ncnn::Mat::Mat(&local_78);
  local_78.w = local_2c;
  local_78.h = local_30;
  __n = &local_91;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x6af37f);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_RDI,(size_type)__n,in_stack_ffffffffffffff20);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x6af39f);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_90,0);
  ncnn::Mat::operator=
            (in_stack_ffffffffffffff18,
             (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_90,1);
  ncnn::Mat::operator=
            (in_stack_ffffffffffffff18,
             (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  this_00 = (Mat *)local_c1;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x6af3f9);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(in_RDI,(size_type)__n,local_10);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x6af419);
  iVar1 = (**(code **)&((in_RDI->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                        super__Vector_impl_data._M_start)->h)
                    (in_RDI,&local_90,local_c1 + 1,local_20);
  iVar2 = iVar1;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_c1 + 1),0);
  ncnn::Mat::operator=(this_00,(Mat *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_10);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_10);
  ncnn::Mat::~Mat((Mat *)0x6af490);
  return iVar1;
}

Assistant:

int Interp::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    int outw = output_width;
    int outh = output_height;
    if (bottom_blob.dims == 1)
    {
        w = 1;
        h = 1;
    }
    if (outw == 0 || outh == 0)
    {
        outw = static_cast<int>(w * width_scale);
        outh = static_cast<int>(h * height_scale);
    }

    Mat reference_blob;
    reference_blob.w = outw;
    reference_blob.h = outh;

    std::vector<Mat> bottom_blobs(2);
    bottom_blobs[0] = bottom_blob;
    bottom_blobs[1] = reference_blob;

    std::vector<Mat> top_blobs(1);

    int ret = forward(bottom_blobs, top_blobs, opt);

    top_blob = top_blobs[0];

    return ret;
}